

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_Pixmap *pxm,int XP,int YP,int WP,int HP,int cx,int cy)

{
  int iVar1;
  int y;
  Fl_Region p_Var2;
  Fl_Region p_Var3;
  int local_64;
  int i;
  int H1;
  int W1;
  int Y1;
  int X1;
  Region r;
  int H;
  int W;
  int Y;
  int X;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Pixmap *pxm_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  Y = HP;
  X = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = pxm;
  pxm_local = (Fl_Pixmap *)this;
  iVar1 = Fl_Pixmap::prepare(pxm,XP,YP,WP,HP,&cx,&cy,&W,&H,(int *)((long)&r + 4),(int *)&r);
  if (iVar1 == 0) {
    if (_YP_local->mask_ == 0) {
      copy_offscreen(this,W,H,r._4_4_,(int)r,(ulong)_YP_local->id_,cx,cy);
    }
    else {
      XSetClipMask(fl_display,fl_gc,_YP_local->mask_);
      XSetClipOrigin(fl_display,fl_gc,W - cx,H - cy);
      p_Var2 = Fl_Graphics_Driver::clip_region(&this->super_Fl_Graphics_Driver);
      if (p_Var2 == (Fl_Region)0x0) {
        copy_offscreen(this,W,H,r._4_4_,(int)r,(ulong)_YP_local->id_,cx,cy);
      }
      else {
        p_Var2 = XRectangleRegion(W,H,r._4_4_,(int)r);
        p_Var3 = Fl_Graphics_Driver::clip_region(&this->super_Fl_Graphics_Driver);
        XIntersectRegion(p_Var2,p_Var3,p_Var2);
        for (local_64 = 0; (long)local_64 < p_Var2->numRects; local_64 = local_64 + 1) {
          iVar1 = (int)p_Var2->rects[local_64].x1;
          y = (int)p_Var2->rects[local_64].y1;
          copy_offscreen(this,iVar1,y,
                         (int)p_Var2->rects[local_64].x2 - (int)p_Var2->rects[local_64].x1,
                         (int)p_Var2->rects[local_64].y2 - (int)p_Var2->rects[local_64].y1,
                         (ulong)_YP_local->id_,cx + (iVar1 - W),cy + (y - H));
        }
        XDestroyRegion(p_Var2);
      }
      XSetClipOrigin(fl_display,fl_gc,0);
      Fl_Graphics_Driver::restore_clip(&this->super_Fl_Graphics_Driver);
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_Pixmap *pxm, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  if (pxm->prepare(XP, YP, WP, HP, cx, cy, X, Y, W, H)) return;
  if (pxm->mask_) {
    // make X use the bitmap as a mask:
    XSetClipMask(fl_display, fl_gc, pxm->mask_);
    XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    if (clip_region()) {
      // At this point, XYWH is the bounding box of the intersection between
      // the current clip region and the (portion of the) pixmap we have to draw.
      // The current clip region is often a rectangle. But, when a window with rounded
      // corners is moved above another window, expose events may create a complex clip
      // region made of several (e.g., 10) rectangles. We have to draw only in the clip
      // region, and also to mask out the transparent pixels of the image. This can't
      // be done in a single Xlib call for a multi-rectangle clip region. Thus, we
      // process each rectangle of the intersection between the clip region and XYWH.
      // See also STR #3206.
      Region r = XRectangleRegion(X,Y,W,H);
      XIntersectRegion(r, clip_region(), r);
      int X1, Y1, W1, H1;
      for (int i = 0; i < r->numRects; i++) {
        X1 = r->rects[i].x1;
        Y1 = r->rects[i].y1;
        W1 = r->rects[i].x2 - r->rects[i].x1;
        H1 = r->rects[i].y2 - r->rects[i].y1;
        copy_offscreen(X1, Y1, W1, H1, pxm->id_, cx + (X1 - X), cy + (Y1 - Y));
      }
      XDestroyRegion(r);
    } else {
      copy_offscreen(X, Y, W, H, pxm->id_, cx, cy);
    }
    // put the old clip region back
    XSetClipOrigin(fl_display, fl_gc, 0, 0);
    restore_clip();
  }
  else copy_offscreen(X, Y, W, H, pxm->id_, cx, cy);
}